

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::Writer::triggerDispatch(Writer *this)

{
  Level level;
  char *pcVar1;
  LineNumber line;
  bool bVar2;
  stringstream_t *psVar3;
  element_type *this_00;
  Writer *pWVar4;
  ostream *poVar5;
  string local_368 [32];
  stringstream local_348 [8];
  stringstream reasonStream;
  ostream local_338 [376];
  Writer local_1c0;
  allocator local_141;
  string local_140 [32];
  LogDispatcher local_120;
  LogDispatcher local_108;
  allocator local_e9;
  string local_e8;
  allocator local_b1;
  string local_b0;
  undefined1 local_90 [8];
  LogMessage msg;
  Writer *this_local;
  
  msg.m_message.field_2._8_8_ = this;
  if ((this->m_proceed & 1U) != 0) {
    if (this->m_msg == (LogMessage *)0x0) {
      level = this->m_level;
      pcVar1 = this->m_file;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,pcVar1,&local_b1);
      line = this->m_line;
      pcVar1 = this->m_func;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,pcVar1,&local_e9);
      LogMessage::LogMessage
                ((LogMessage *)local_90,level,&local_b0,line,&local_e8,this->m_verboseLevel,
                 this->m_logger);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      LogDispatcher::LogDispatcher
                (&local_108,(bool)(this->m_proceed & 1),(LogMessage *)local_90,
                 this->m_dispatchAction);
      LogDispatcher::dispatch(&local_108);
      LogMessage::~LogMessage((LogMessage *)local_90);
    }
    else {
      LogDispatcher::LogDispatcher
                (&local_120,(bool)(this->m_proceed & 1),this->m_msg,this->m_dispatchAction);
      LogDispatcher::dispatch(&local_120);
    }
  }
  if (this->m_logger != (Logger *)0x0) {
    psVar3 = Logger::stream_abi_cxx11_(this->m_logger);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"",&local_141);
    std::__cxx11::stringstream::str((string *)psVar3);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
  }
  if (((this->m_proceed & 1U) != 0) && (this->m_level == Fatal)) {
    this_00 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)elStorage);
    bVar2 = Storage::hasFlag(this_00,DisableApplicationAbortOnFatalLog);
    if (!bVar2) {
      Writer(&local_1c0,Warning,this->m_file,this->m_line,this->m_func,NormalLog,0);
      pWVar4 = construct(&local_1c0,1,consts::kDefaultLoggerId);
      pWVar4 = operator<<(pWVar4,(char (*) [45])"Aborting application. Reason: Fatal log at [");
      pWVar4 = operator<<(pWVar4,&this->m_file);
      pWVar4 = operator<<(pWVar4,(char (*) [2])":");
      pWVar4 = operator<<(pWVar4,&this->m_line);
      operator<<(pWVar4,(char (*) [2])"]");
      ~Writer(&local_1c0);
      std::__cxx11::stringstream::stringstream(local_348);
      poVar5 = std::operator<<(local_338,"Fatal log at [");
      poVar5 = std::operator<<(poVar5,this->m_file);
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_line);
      poVar5 = std::operator<<(poVar5,"]");
      poVar5 = std::operator<<(poVar5," If you wish to disable \'abort on fatal log\' please use ");
      std::operator<<(poVar5,
                      "el::Loggers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)");
      std::__cxx11::stringstream::str();
      utils::abort();
      std::__cxx11::string::~string(local_368);
      std::__cxx11::stringstream::~stringstream(local_348);
    }
  }
  this->m_proceed = false;
  return;
}

Assistant:

void Writer::triggerDispatch(void) {
  if (m_proceed) {
    if (m_msg == nullptr) {
      LogMessage msg(m_level, m_file, m_line, m_func, m_verboseLevel,
                     m_logger);
      base::LogDispatcher(m_proceed, &msg, m_dispatchAction).dispatch();
    } else {
      base::LogDispatcher(m_proceed, m_msg, m_dispatchAction).dispatch();
    }
  }
  if (m_logger != nullptr) {
    m_logger->stream().str(ELPP_LITERAL(""));
    m_logger->releaseLock();
  }
  if (m_proceed && m_level == Level::Fatal
      && !ELPP->hasFlag(LoggingFlag::DisableApplicationAbortOnFatalLog)) {
    base::Writer(Level::Warning, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
        << "Aborting application. Reason: Fatal log at [" << m_file << ":" << m_line << "]";
    std::stringstream reasonStream;
    reasonStream << "Fatal log at [" << m_file << ":" << m_line << "]"
                 << " If you wish to disable 'abort on fatal log' please use "
                 << "el::Loggers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)";
    base::utils::abort(1, reasonStream.str());
  }
  m_proceed = false;
}